

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O1

void google::protobuf::internal::LogIndexOutOfBounds(int index,int size)

{
  LogMessage *this;
  string_view str;
  string_view str_00;
  int local_2c;
  LogMessage local_28;
  
  absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
            ((LogMessageDebugFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.cc"
             ,0x21);
  str._M_str = "Index ";
  str._M_len = 6;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_28,str);
  local_2c = index;
  this = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(&local_28,&local_2c);
  str_00._M_str = " out of bounds ";
  str_00._M_len = 0xf;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this,str_00);
  local_2c = size;
  absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(this,&local_2c);
  absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
            ((LogMessageDebugFatal *)&local_28);
  return;
}

Assistant:

void LogIndexOutOfBounds(int index, int size) {
  ABSL_DLOG(FATAL) << "Index " << index << " out of bounds " << size;
}